

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.cxx
# Opt level: O2

void fixvisible(Fl_Type *p)

{
  Fl_Type *pFVar1;
  Fl_Type *pFVar2;
  Fl_Type *t;
  bool bVar3;
  
  pFVar2 = p;
  do {
    pFVar1 = pFVar2->parent;
    if (pFVar1 == (Fl_Type *)0x0) {
      bVar3 = true;
    }
    else if (pFVar1->visible == '\0') {
      bVar3 = false;
    }
    else {
      bVar3 = pFVar1->open_ != '\0';
    }
    pFVar2->visible = bVar3;
    pFVar2 = pFVar2->next;
  } while ((pFVar2 != (Fl_Type *)0x0) && (p->level < pFVar2->level));
  return;
}

Assistant:

static void fixvisible(Fl_Type *p) {
  Fl_Type *t = p;
  for (;;) {
    if (t->parent) t->visible = t->parent->visible && t->parent->open_;
    else t->visible = 1;
    t = t->next;
    if (!t || t->level <= p->level) break;
  }
}